

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O2

int SHA512_Update(SHA512_CTX *c,void *data,size_t len)

{
  ulonglong *puVar1;
  void *__dest;
  ulong uVar2;
  uint uVar3;
  void *in_RAX;
  ulong uVar4;
  void *extraout_RAX;
  ulong uVar5;
  long lVar6;
  
  if (len == 0) goto LAB_0012065a;
  if ((c == (SHA512_CTX *)0x0) || (data == (void *)0x0)) {
    __assert_fail("context != (SHA512_CTX*)0 && data != (sha2_byte*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x349,"void SHA512_Update(SHA512_CTX *, const sha2_byte *, size_t)");
  }
  uVar3 = (uint)c->Nl >> 3 & 0x7f;
  in_RAX = (void *)(ulong)uVar3;
  if (uVar3 == 0) {
LAB_001205e0:
    lVar6 = len * -8;
    for (; 0x7f < len; len = len - 0x80) {
      SHA512_Transform(c,(uchar *)data);
      in_RAX = (void *)c->Nl;
      c->Nl = (long)in_RAX + 0x400;
      if ((void *)0xfffffffffffffbff < in_RAX) {
        c->Nh = c->Nh + 1;
      }
      data = (void *)((long)data + 0x80);
      lVar6 = lVar6 + 0x400;
    }
    if (len == 0) goto LAB_0012065a;
    memcpy(&c->u,data,len);
    in_RAX = (void *)(c->Nl - lVar6);
    c->Nl = (ulonglong)in_RAX;
    if ((void *)-lVar6 <= in_RAX) goto LAB_0012065a;
  }
  else {
    uVar5 = (ulong)(0x80 - uVar3);
    __dest = (void *)((long)c->h + (ulong)uVar3 + 0x50);
    if (uVar5 <= len) {
      memcpy(__dest,data,uVar5);
      uVar4 = (ulong)((0x80 - uVar3) * 8);
      puVar1 = &c->Nl;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar4;
      if (CARRY8(uVar2,uVar4)) {
        c->Nh = c->Nh + 1;
      }
      data = (void *)((long)data + uVar5);
      SHA512_Transform(c,(c->u).p);
      in_RAX = extraout_RAX;
      len = len - uVar5;
      goto LAB_001205e0;
    }
    in_RAX = memcpy(__dest,data,len);
    puVar1 = &c->Nl;
    uVar5 = *puVar1;
    *puVar1 = *puVar1 + len * 8;
    if (!CARRY8(uVar5,len * 8)) goto LAB_0012065a;
  }
  c->Nh = c->Nh + 1;
LAB_0012065a:
  return (int)in_RAX;
}

Assistant:

void SHA512_Update(SHA512_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0 && data != (sha2_byte*)0);

	usedspace = (context->bitcount[0] >> 3) % SHA512_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA512_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, freespace);
			ADDINC128(context->bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
			SHA512_Transform(context, (sha2_word64*)context->buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, len);
			ADDINC128(context->bitcount, len << 3);
			return;
		}
	}
	while (len >= SHA512_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		SHA512_Transform(context, (sha2_word64*)data);
		ADDINC128(context->bitcount, SHA512_BLOCK_LENGTH << 3);
		len -= SHA512_BLOCK_LENGTH;
		data += SHA512_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		ADDINC128(context->bitcount, len << 3);
	}
}